

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

void __thiscall TypeOpStore::printRaw(TypeOpStore *this,ostream *s,PcodeOp *op)

{
  Varnode *pVVar1;
  Address *addr;
  AddrSpace *this_00;
  string *psVar2;
  ostream *poVar3;
  AddrSpace *spc;
  PcodeOp *op_local;
  ostream *s_local;
  TypeOpStore *this_local;
  
  std::operator<<(s,"*(");
  pVVar1 = PcodeOp::getIn(op,0);
  addr = Varnode::getAddr(pVVar1);
  this_00 = Address::getSpaceFromConst(addr);
  psVar2 = AddrSpace::getName_abi_cxx11_(this_00);
  poVar3 = std::operator<<(s,(string *)psVar2);
  std::operator<<(poVar3,',');
  pVVar1 = PcodeOp::getIn(op,1);
  Varnode::printRaw(pVVar1,s);
  std::operator<<(s,") = ");
  pVVar1 = PcodeOp::getIn(op,2);
  Varnode::printRaw(pVVar1,s);
  return;
}

Assistant:

void TypeOpStore::printRaw(ostream &s,const PcodeOp *op)

{
  s << "*(";
  AddrSpace *spc = Address::getSpaceFromConst(op->getIn(0)->getAddr());
  s << spc->getName() << ',';
  op->getIn(1)->printRaw(s);
  s << ") = ";
  op->getIn(2)->printRaw(s);
}